

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O0

__type __thiscall NS::wrap<int,char_const*>(NS *this,int first,char *rest)

{
  N *in_RDI;
  __type _Var1;
  _Head_base<1UL,_N_*,_false> __tpls;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  NS *in_stack_ffffffffffffffd8;
  
  __tpls._M_head_impl = in_RDI;
  wrap<int>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  wrap<char_const*>(in_stack_ffffffffffffffd8,
                    (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  _Var1 = std::tuple_cat<std::tuple<N*>,std::tuple<N*>,void>
                    ((tuple<N_*> *)__tpls._M_head_impl,(tuple<N_*> *)in_RDI);
  _Var1.super__Tuple_impl<0UL,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*>.
  super__Head_base<1UL,_N_*,_false>._M_head_impl =
       (_Head_base<1UL,_N_*,_false>)(_Head_base<1UL,_N_*,_false>)__tpls._M_head_impl;
  return (__type)_Var1.super__Tuple_impl<0UL,_N_*,_N_*>;
}

Assistant:

auto wrap(DataType first, Args  ... rest) {
        return std::tuple_cat(wrap(first), wrap(rest...));
    }